

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collation_binding.cpp
# Opt level: O2

bool duckdb::PushVarcharCollation
               (ClientContext *context,
               unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *source
               ,LogicalType *sql_type,CollationType type)

{
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var1;
  pointer prVar2;
  optional_ptr<duckdb::Binder,_true> oVar3;
  bool bVar4;
  Catalog *this;
  size_type sVar5;
  CollateCatalogEntry *pCVar6;
  reference pvVar7;
  BinderException *this_00;
  pointer prVar8;
  pointer __k;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  children;
  vector<std::reference_wrapper<duckdb::CollateCatalogEntry>,_true> entries;
  FunctionBinder local_270;
  ClientContext *local_260;
  string collation;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  splits;
  FunctionBinder function_binder;
  undefined1 local_208 [24];
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  collations;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  string str_collation;
  ScalarFunction local_158;
  
  if (sql_type->id_ != VARCHAR) {
    return false;
  }
  StringType::GetCollation_abi_cxx11_((string *)&str_collation,(StringType *)sql_type,sql_type);
  collation._M_dataplus._M_p = (pointer)&collation.field_2;
  collation._M_string_length = 0;
  collation.field_2._M_local_buf[0] = '\0';
  if (str_collation._M_string_length == 0) {
    DBConfig::GetConfig(context);
  }
  ::std::__cxx11::string::_M_assign((string *)&collation);
  StringUtil::Lower((string *)&collations,(string *)&collation);
  ::std::__cxx11::string::operator=((string *)&collation,(string *)&collations);
  ::std::__cxx11::string::~string((string *)&collations);
  if ((((collation._M_string_length == 0) || (bVar4 = ::std::operator==(&collation,"binary"), bVar4)
       ) || (bVar4 = ::std::operator==(&collation,"c"), bVar4)) ||
     (bVar4 = ::std::operator==(&collation,"posix"), bVar4)) {
    bVar4 = false;
  }
  else {
    this = Catalog::GetSystemCatalog(context);
    StringUtil::Lower((string *)&collations,(string *)&collation);
    ::std::__cxx11::string::string((string *)&children,".",(allocator *)&entries);
    local_270.context._4_4_ = type;
    local_260 = context;
    StringUtil::Split(&splits,(string *)&collations,(string *)&children);
    ::std::__cxx11::string::~string((string *)&children);
    ::std::__cxx11::string::~string((string *)&collations._M_h);
    entries.
    super_vector<std::reference_wrapper<duckdb::CollateCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CollateCatalogEntry>_>_>
    .
    super__Vector_base<std::reference_wrapper<duckdb::CollateCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CollateCatalogEntry>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    entries.
    super_vector<std::reference_wrapper<duckdb::CollateCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CollateCatalogEntry>_>_>
    .
    super__Vector_base<std::reference_wrapper<duckdb::CollateCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CollateCatalogEntry>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    entries.
    super_vector<std::reference_wrapper<duckdb::CollateCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CollateCatalogEntry>_>_>
    .
    super__Vector_base<std::reference_wrapper<duckdb::CollateCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CollateCatalogEntry>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    collations._M_h._M_buckets = &collations._M_h._M_single_bucket;
    collations._M_h._M_bucket_count = 1;
    collations._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    collations._M_h._M_element_count = 0;
    collations._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    collations._M_h._M_rehash_policy._M_next_resize = 0;
    collations._M_h._M_single_bucket = (__node_base_ptr)0x0;
    for (__k = splits.
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
        prVar2 = entries.
                 super_vector<std::reference_wrapper<duckdb::CollateCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CollateCatalogEntry>_>_>
                 .
                 super__Vector_base<std::reference_wrapper<duckdb::CollateCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CollateCatalogEntry>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,
        __k != splits.
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish; __k = __k + 1) {
      sVar5 = ::std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
              ::count(&collations._M_h,__k);
      if (sVar5 == 0) {
        ::std::__cxx11::string::string((string *)&children,"main",(allocator *)&function_binder);
        pCVar6 = Catalog::GetEntry<duckdb::CollateCatalogEntry>
                           (this,local_260,(string *)&children,__k,
                            (QueryErrorContext)0xffffffffffffffff);
        ::std::__cxx11::string::~string((string *)&children);
        if (pCVar6->combinable == true) {
          children.
          super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          .
          super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)pCVar6;
          ::std::
          vector<std::reference_wrapper<duckdb::CollateCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CollateCatalogEntry>_>_>
          ::_M_insert_rval(&entries.
                            super_vector<std::reference_wrapper<duckdb::CollateCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CollateCatalogEntry>_>_>
                           ,(const_iterator)
                            entries.
                            super_vector<std::reference_wrapper<duckdb::CollateCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CollateCatalogEntry>_>_>
                            .
                            super__Vector_base<std::reference_wrapper<duckdb::CollateCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CollateCatalogEntry>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,(value_type *)&children);
        }
        else {
          if ((entries.
               super_vector<std::reference_wrapper<duckdb::CollateCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CollateCatalogEntry>_>_>
               .
               super__Vector_base<std::reference_wrapper<duckdb::CollateCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CollateCatalogEntry>_>_>
               ._M_impl.super__Vector_impl_data._M_start !=
               entries.
               super_vector<std::reference_wrapper<duckdb::CollateCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CollateCatalogEntry>_>_>
               .
               super__Vector_base<std::reference_wrapper<duckdb::CollateCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CollateCatalogEntry>_>_>
               ._M_impl.super__Vector_impl_data._M_finish) &&
             (pvVar7 = vector<std::reference_wrapper<duckdb::CollateCatalogEntry>,_true>::back
                                 (&entries), pvVar7->_M_data->combinable == false)) {
            this_00 = (BinderException *)__cxa_allocate_exception(0x10);
            ::std::__cxx11::string::string
                      ((string *)&children,"Cannot combine collation types \"%s\" and \"%s\"",
                       (allocator *)&function_binder);
            pvVar7 = vector<std::reference_wrapper<duckdb::CollateCatalogEntry>,_true>::back
                               (&entries);
            ::std::__cxx11::string::string
                      ((string *)&local_198,
                       (string *)
                       &(pvVar7->_M_data->super_StandardEntry).super_InCatalogEntry.
                        super_CatalogEntry.name);
            ::std::__cxx11::string::string
                      ((string *)&local_1b8,
                       (string *)
                       &(pCVar6->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.name);
            BinderException::BinderException<std::__cxx11::string,std::__cxx11::string>
                      (this_00,(string *)&children,&local_198,&local_1b8);
            __cxa_throw(this_00,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
          }
          children.
          super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          .
          super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)pCVar6;
          ::std::
          vector<std::reference_wrapper<duckdb::CollateCatalogEntry>,std::allocator<std::reference_wrapper<duckdb::CollateCatalogEntry>>>
          ::emplace_back<std::reference_wrapper<duckdb::CollateCatalogEntry>>
                    ((vector<std::reference_wrapper<duckdb::CollateCatalogEntry>,std::allocator<std::reference_wrapper<duckdb::CollateCatalogEntry>>>
                      *)&entries,(reference_wrapper<duckdb::CollateCatalogEntry> *)&children);
        }
        ::std::__detail::
        _Insert_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
        ::insert((_Insert_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                  *)&collations._M_h,__k);
      }
    }
    prVar8 = entries.
             super_vector<std::reference_wrapper<duckdb::CollateCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CollateCatalogEntry>_>_>
             .
             super__Vector_base<std::reference_wrapper<duckdb::CollateCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CollateCatalogEntry>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    while ((bVar4 = prVar8 == prVar2, !bVar4 &&
           ((pCVar6 = prVar8->_M_data, local_270.context._4_4_ != COMBINABLE_COLLATIONS ||
            (pCVar6->combinable != false))))) {
      children.
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      children.
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      children.
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                  *)&children,source);
      FunctionBinder::FunctionBinder(&function_binder,local_260);
      ScalarFunction::ScalarFunction(&local_158,&pCVar6->function);
      local_208._0_8_ =
           children.
           super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_208._8_8_ =
           children.
           super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_208._16_8_ =
           children.
           super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      children.
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      children.
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      children.
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      FunctionBinder::BindScalarFunction
                (&local_270,(ScalarFunction *)&function_binder,
                 (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                  *)&local_158,
                 SUB81((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                        *)local_208,0),(optional_ptr<duckdb::Binder,_true>)0x0);
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 *)local_208);
      ScalarFunction::~ScalarFunction(&local_158);
      oVar3.ptr = local_270.binder.ptr;
      local_270.binder.ptr = (Binder *)0x0;
      _Var1._M_head_impl =
           (source->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
           _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
           _M_t.
           super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
           super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
      (source->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
      super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
      super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)oVar3.ptr;
      if ((_Var1._M_head_impl != (Expression *)0x0) &&
         ((**(code **)(*(long *)&(_Var1._M_head_impl)->super_BaseExpression + 8))(),
         local_270.binder.ptr != (Binder *)0x0)) {
        (*((BaseExpression *)&(local_270.binder.ptr)->super_enable_shared_from_this<duckdb::Binder>)
          ->_vptr_BaseExpression[1])();
      }
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ::~vector(&children.
                 super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               );
      prVar8 = prVar8 + 1;
    }
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable(&collations._M_h);
    ::std::
    _Vector_base<std::reference_wrapper<duckdb::CollateCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CollateCatalogEntry>_>_>
    ::~_Vector_base((_Vector_base<std::reference_wrapper<duckdb::CollateCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CollateCatalogEntry>_>_>
                     *)&entries);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&splits);
  }
  ::std::__cxx11::string::~string((string *)&collation);
  ::std::__cxx11::string::~string((string *)&str_collation);
  return bVar4;
}

Assistant:

bool PushVarcharCollation(ClientContext &context, unique_ptr<Expression> &source, const LogicalType &sql_type,
                          CollationType type) {
	if (sql_type.id() != LogicalTypeId::VARCHAR) {
		// only VARCHAR columns require collation
		return false;
	}
	// replace default collation with system collation
	auto str_collation = StringType::GetCollation(sql_type);
	string collation;
	if (str_collation.empty()) {
		collation = DBConfig::GetConfig(context).options.collation;
	} else {
		collation = str_collation;
	}
	collation = StringUtil::Lower(collation);
	// bind the collation
	if (collation.empty() || collation == "binary" || collation == "c" || collation == "posix") {
		// no collation or binary collation: skip
		return false;
	}
	auto &catalog = Catalog::GetSystemCatalog(context);
	auto splits = StringUtil::Split(StringUtil::Lower(collation), ".");
	vector<reference<CollateCatalogEntry>> entries;
	unordered_set<string> collations;
	for (auto &collation_argument : splits) {
		if (collations.count(collation_argument)) {
			// we already applied this collation
			continue;
		}
		auto &collation_entry = catalog.GetEntry<CollateCatalogEntry>(context, DEFAULT_SCHEMA, collation_argument);
		if (collation_entry.combinable) {
			entries.insert(entries.begin(), collation_entry);
		} else {
			if (!entries.empty() && !entries.back().get().combinable) {
				throw BinderException("Cannot combine collation types \"%s\" and \"%s\"", entries.back().get().name,
				                      collation_entry.name);
			}
			entries.push_back(collation_entry);
		}
		collations.insert(collation_argument);
	}
	for (auto &entry : entries) {
		auto &collation_entry = entry.get();
		if (!collation_entry.combinable && type == CollationType::COMBINABLE_COLLATIONS) {
			// not a combinable collation - ignore
			return false;
		}
		vector<unique_ptr<Expression>> children;
		children.push_back(std::move(source));

		FunctionBinder function_binder(context);
		auto function = function_binder.BindScalarFunction(collation_entry.function, std::move(children));
		source = std::move(function);
	}
	return true;
}